

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalNinjaGenerator::WriteBuild
          (cmGlobalNinjaGenerator *this,ostream *os,cmNinjaBuild *build,int cmdLineLimit,
          bool *usedResponseFile)

{
  cmGlobalNinjaGenerator *pcVar1;
  pointer pbVar2;
  bool bVar3;
  _Base_ptr p_Var4;
  ostream *poVar5;
  string *implicitOut;
  pointer pbVar6;
  cmGlobalNinjaGenerator *this_00;
  char *pcVar7;
  cmGlobalNinjaGenerator *this_01;
  string *this_02;
  string *output;
  cmGlobalNinjaGenerator *path;
  allocator<char> local_272;
  allocator<char> local_271;
  string local_270;
  uint local_24c;
  string arguments;
  string assignments;
  string buildStr;
  string local_1c8;
  ostringstream variable_assignments;
  string local_1a0 [368];
  
  if ((build->Rule)._M_string_length == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &variable_assignments,"No rule for WriteBuild! called with comment: ",
                   &build->Comment);
    cmSystemTools::Error
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &variable_assignments);
  }
  else {
    if ((build->Outputs).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (build->Outputs).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_24c = cmdLineLimit;
      WriteComment(os,&build->Comment);
      this_00 = (cmGlobalNinjaGenerator *)0x4370ec;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&buildStr,"build",(allocator<char> *)&variable_assignments);
      this_01 = (cmGlobalNinjaGenerator *)&build->Rule;
      pcVar1 = (cmGlobalNinjaGenerator *)
               (build->Outputs).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (path = (cmGlobalNinjaGenerator *)
                  (build->Outputs).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; path != pcVar1;
          path = (cmGlobalNinjaGenerator *)
                 &(path->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.MakeSilentFlag.
                  field_2) {
        EncodePath(&arguments,this_00,(string *)path);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &variable_assignments," ",&arguments);
        this_00 = (cmGlobalNinjaGenerator *)&variable_assignments;
        std::__cxx11::string::append((string *)&buildStr);
        std::__cxx11::string::~string((string *)&variable_assignments);
        std::__cxx11::string::~string((string *)&arguments);
        if (this->ComputingUnknownDependencies == true) {
          this_00 = path;
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&this->CombinedBuildOutputs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)path);
        }
      }
      if ((build->ImplicitOuts).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (build->ImplicitOuts).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pcVar7 = " |";
        std::__cxx11::string::append((char *)&buildStr);
        pbVar2 = (build->ImplicitOuts).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar6 = (build->ImplicitOuts).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar2;
            pbVar6 = pbVar6 + 1) {
          EncodePath(&arguments,(cmGlobalNinjaGenerator *)pcVar7,pbVar6);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &variable_assignments," ",&arguments);
          pcVar7 = (char *)&variable_assignments;
          std::__cxx11::string::append((string *)&buildStr);
          std::__cxx11::string::~string((string *)&variable_assignments);
          std::__cxx11::string::~string((string *)&arguments);
        }
      }
      std::__cxx11::string::append((char *)&buildStr);
      std::__cxx11::string::append((char *)&buildStr);
      std::__cxx11::string::append((string *)&buildStr);
      arguments._M_dataplus._M_p = (pointer)&arguments.field_2;
      arguments._M_string_length = 0;
      arguments.field_2._M_local_buf[0] = '\0';
      pbVar2 = (build->ExplicitDeps).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar6 = (build->ExplicitDeps).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar2; pbVar6 = pbVar6 + 1
          ) {
        EncodePath(&assignments,this_01,pbVar6);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &variable_assignments," ",&assignments);
        this_01 = (cmGlobalNinjaGenerator *)&variable_assignments;
        std::__cxx11::string::append((string *)&arguments);
        std::__cxx11::string::~string((string *)&variable_assignments);
        std::__cxx11::string::~string((string *)&assignments);
      }
      if ((build->ImplicitDeps).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (build->ImplicitDeps).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pcVar7 = " |";
        std::__cxx11::string::append((char *)&arguments);
        pbVar2 = (build->ImplicitDeps).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar6 = (build->ImplicitDeps).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar2;
            pbVar6 = pbVar6 + 1) {
          EncodePath(&assignments,(cmGlobalNinjaGenerator *)pcVar7,pbVar6);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &variable_assignments," ",&assignments);
          pcVar7 = (char *)&variable_assignments;
          std::__cxx11::string::append((string *)&arguments);
          std::__cxx11::string::~string((string *)&variable_assignments);
          std::__cxx11::string::~string((string *)&assignments);
        }
      }
      if ((build->OrderOnlyDeps).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (build->OrderOnlyDeps).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pcVar7 = " ||";
        std::__cxx11::string::append((char *)&arguments);
        pbVar2 = (build->OrderOnlyDeps).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar6 = (build->OrderOnlyDeps).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar2;
            pbVar6 = pbVar6 + 1) {
          EncodePath(&assignments,(cmGlobalNinjaGenerator *)pcVar7,pbVar6);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &variable_assignments," ",&assignments);
          pcVar7 = (char *)&variable_assignments;
          std::__cxx11::string::append((string *)&arguments);
          std::__cxx11::string::~string((string *)&variable_assignments);
          std::__cxx11::string::~string((string *)&assignments);
        }
      }
      std::__cxx11::string::append((char *)&arguments);
      assignments._M_dataplus._M_p = (pointer)&assignments.field_2;
      assignments._M_string_length = 0;
      assignments.field_2._M_local_buf[0] = '\0';
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&variable_assignments);
      for (p_Var4 = (build->Variables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var4 != &(build->Variables)._M_t._M_impl.super__Rb_tree_header;
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_270,"",(allocator<char> *)&local_1c8);
        WriteVariable((ostream *)&variable_assignments,(string *)(p_Var4 + 1),(string *)(p_Var4 + 2)
                      ,&local_270,1);
        std::__cxx11::string::~string((string *)&local_270);
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&assignments,(string *)&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      if (((int)local_24c < 0) ||
         ((local_24c != 0 &&
          ((ulong)local_24c <
           arguments._M_string_length + buildStr._M_string_length + assignments._M_string_length +
           1000)))) {
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
        local_270._M_string_length = 0;
        local_270.field_2._M_local_buf[0] = '\0';
        std::__cxx11::stringbuf::str(local_1a0);
        std::__cxx11::string::~string((string *)&local_270);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_270,"RSP_FILE",&local_271);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"",&local_272);
        WriteVariable((ostream *)&variable_assignments,&local_270,&build->RspFile,&local_1c8,1);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_270);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::append((string *)&assignments);
        std::__cxx11::string::~string((string *)&local_270);
        bVar3 = true;
      }
      else {
        bVar3 = false;
      }
      if (usedResponseFile != (bool *)0x0) {
        *usedResponseFile = bVar3;
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&variable_assignments);
      poVar5 = std::operator<<(os,(string *)&buildStr);
      poVar5 = std::operator<<(poVar5,(string *)&arguments);
      poVar5 = std::operator<<(poVar5,(string *)&assignments);
      std::operator<<(poVar5,"\n");
      std::__cxx11::string::~string((string *)&assignments);
      std::__cxx11::string::~string((string *)&arguments);
      this_02 = &buildStr;
      goto LAB_00222dbc;
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &variable_assignments,"No output files for WriteBuild! called with comment: ",
                   &build->Comment);
    cmSystemTools::Error
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &variable_assignments);
  }
  this_02 = (string *)&variable_assignments;
LAB_00222dbc:
  std::__cxx11::string::~string((string *)this_02);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteBuild(std::ostream& os,
                                        cmNinjaBuild const& build,
                                        int cmdLineLimit,
                                        bool* usedResponseFile)
{
  // Make sure there is a rule.
  if (build.Rule.empty()) {
    cmSystemTools::Error("No rule for WriteBuild! called with comment: " +
                         build.Comment);
    return;
  }

  // Make sure there is at least one output file.
  if (build.Outputs.empty()) {
    cmSystemTools::Error(
      "No output files for WriteBuild! called with comment: " + build.Comment);
    return;
  }

  cmGlobalNinjaGenerator::WriteComment(os, build.Comment);

  // Write output files.
  std::string buildStr("build");
  {
    // Write explicit outputs
    for (std::string const& output : build.Outputs) {
      buildStr += " " + EncodePath(output);
      if (this->ComputingUnknownDependencies) {
        this->CombinedBuildOutputs.insert(output);
      }
    }
    // Write implicit outputs
    if (!build.ImplicitOuts.empty()) {
      buildStr += " |";
      for (std::string const& implicitOut : build.ImplicitOuts) {
        buildStr += " " + EncodePath(implicitOut);
      }
    }
    buildStr += ":";

    // Write the rule.
    buildStr += " ";
    buildStr += build.Rule;
  }

  std::string arguments;
  {
    // TODO: Better formatting for when there are multiple input/output files.

    // Write explicit dependencies.
    for (std::string const& explicitDep : build.ExplicitDeps) {
      arguments += " " + EncodePath(explicitDep);
    }

    // Write implicit dependencies.
    if (!build.ImplicitDeps.empty()) {
      arguments += " |";
      for (std::string const& implicitDep : build.ImplicitDeps) {
        arguments += " " + EncodePath(implicitDep);
      }
    }

    // Write order-only dependencies.
    if (!build.OrderOnlyDeps.empty()) {
      arguments += " ||";
      for (std::string const& orderOnlyDep : build.OrderOnlyDeps) {
        arguments += " " + EncodePath(orderOnlyDep);
      }
    }

    arguments += "\n";
  }

  // Write the variables bound to this build statement.
  std::string assignments;
  {
    std::ostringstream variable_assignments;
    for (auto const& variable : build.Variables) {
      cmGlobalNinjaGenerator::WriteVariable(
        variable_assignments, variable.first, variable.second, "", 1);
    }

    // check if a response file rule should be used
    assignments = variable_assignments.str();
    bool useResponseFile = false;
    if (cmdLineLimit < 0 ||
        (cmdLineLimit > 0 &&
         (arguments.size() + buildStr.size() + assignments.size() + 1000) >
           static_cast<size_t>(cmdLineLimit))) {
      variable_assignments.str(std::string());
      cmGlobalNinjaGenerator::WriteVariable(variable_assignments, "RSP_FILE",
                                            build.RspFile, "", 1);
      assignments += variable_assignments.str();
      useResponseFile = true;
    }
    if (usedResponseFile) {
      *usedResponseFile = useResponseFile;
    }
  }

  os << buildStr << arguments << assignments << "\n";
}